

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

void __thiscall TidyConfigParser::parseCheckConfigs(TidyConfigParser *this)

{
  char cVar1;
  byte __c;
  char extraout_AL;
  int iVar2;
  undefined7 extraout_var;
  ulong uVar3;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined8 extraout_RAX;
  uint uVar4;
  ulong unaff_RBP;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string optionValue_1;
  string optionValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionValues;
  string optionName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  undefined7 extraout_var_00;
  
  do {
    uVar4 = (uint)unaff_RBP;
    if (((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) != 0) {
      return;
    }
    cVar1 = peekChar(this);
    if (cVar1 == '\n') {
      nextChar(this);
    }
    optionName._M_dataplus._M_p = (pointer)&optionName.field_2;
    optionName._M_string_length = 0;
    optionName.field_2._M_local_buf[0] = '\0';
    cVar1 = readIf<int_(*)(int)_noexcept,_true>(this,&optionName,isalpha);
    if (cVar1 != ':') {
LAB_0018bcd9:
      optionValue._M_dataplus._M_p._0_4_ = (int)cVar1;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&optionValue;
      fmt_00.size_ = 0x81;
      fmt_00.data_ = (char *)0x29;
      optionValue.field_2._M_local_buf[0] = cVar1;
      ::fmt::v11::vformat_abi_cxx11_
                (&optionValue_1,(v11 *)"Expected \':\' or a letter but found ({}){}",fmt_00,args_00)
      ;
      reportErrorAndExit(this,&optionValue_1);
LAB_0018bd0a:
      optionValue._M_dataplus._M_p._0_4_ = 0x2c;
      optionValue.field_2._M_local_buf[0] = ',';
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&optionValue;
      fmt_01.size_ = 0x81;
      fmt_01.data_ = (char *)0x23;
      ::fmt::v11::vformat_abi_cxx11_
                (&optionValue_1,(v11 *)"Expected new line but found: ({}){}",fmt_01,args_01);
      reportErrorAndExit(this,&optionValue_1);
LAB_0018bd3d:
      optionValue.field_2._M_local_buf[0] = (char)uVar4;
      optionValue._M_dataplus._M_p._0_4_ = (int)optionValue.field_2._M_local_buf[0];
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&optionValue;
      fmt_02.size_ = 0x81;
      fmt_02.data_ = (char *)0x32;
      ::fmt::v11::vformat_abi_cxx11_
                (&optionValue_1,(v11 *)"Expected \',\' new line or a letter but found ({}){}",fmt_02
                 ,args_02);
      reportErrorAndExit(this,&optionValue_1);
LAB_0018bd6f:
      optionValue._M_dataplus._M_p._0_4_ = uVar4;
      optionValue.field_2._M_local_buf[0] = (char)uVar4;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&optionValue;
      fmt_03.size_ = 0x81;
      fmt_03.data_ = (char *)0x1d;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_50,(v11 *)"Expected \'\"\' but found ({}){}",fmt_03,args_03);
      reportErrorAndExit(this,&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&optionValues);
      std::__cxx11::string::~string((string *)&optionName);
      _Unwind_Resume(extraout_RAX);
    }
    optionValues.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    optionValues.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    optionValues.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar1 = peekChar(this);
    if (cVar1 == '[') {
      nextChar(this);
      do {
        optionValue._M_dataplus._M_p = (pointer)&optionValue.field_2;
        optionValue._M_string_length = 0;
        optionValue.field_2._M_local_buf[0] = '\0';
        cVar1 = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                          (this,&optionValue);
        uVar4 = (uint)CONCAT71(extraout_var,cVar1);
        if (optionValue._M_string_length != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &optionValues,&optionValue);
        }
        std::__cxx11::string::~string((string *)&optionValue);
      } while (cVar1 == ',');
      if (cVar1 != ']') {
        optionValue._M_dataplus._M_p._0_4_ = (int)cVar1;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&optionValue;
        fmt.size_ = 0x81;
        fmt.data_ = (char *)0x1d;
        optionValue.field_2._M_local_buf[0] = cVar1;
        ::fmt::v11::vformat_abi_cxx11_
                  (&optionValue_1,(v11 *)"Expected \']\' but found ({}){}",fmt,args);
        reportErrorAndExit(this,&optionValue_1);
        cVar1 = extraout_AL;
        goto LAB_0018bcd9;
      }
      cVar1 = nextChar(this);
      uVar3 = CONCAT71(extraout_var_00,cVar1);
    }
    else {
      cVar1 = peekChar(this);
      if (cVar1 == '\"') {
        nextChar(this);
        optionValue_1._M_dataplus._M_p = (pointer)&optionValue_1.field_2;
        optionValue_1._M_string_length = 0;
        optionValue_1.field_2._M_local_buf[0] = '\0';
        while( true ) {
          __c = nextChar(this);
          uVar4 = (uint)(char)__c;
          iVar2 = isalnum(uVar4);
          if ((iVar2 == 0) &&
             (((0x3b < __c - 0x24 || ((0xf800000080004f1U >> ((ulong)(__c - 0x24) & 0x3f) & 1) == 0)
               ) && (2 < __c - 0x7b)))) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&optionValue_1,__c);
        }
        if (optionValue_1._M_string_length != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &optionValues,&optionValue_1);
        }
        if (__c != 0x22) goto LAB_0018bd6f;
        cVar1 = nextChar(this);
        uVar3 = CONCAT71(extraout_var_01,cVar1);
        this_00 = &optionValue_1;
      }
      else {
        optionValue._M_dataplus._M_p = (pointer)&optionValue.field_2;
        optionValue._M_string_length = 0;
        optionValue.field_2._M_local_buf[0] = '\0';
        cVar1 = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                          (this,&optionValue);
        uVar3 = CONCAT71(extraout_var_02,cVar1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &optionValues,&optionValue);
        this_00 = &optionValue;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    unaff_RBP = uVar3 & 0xffffffff;
    uVar4 = (uint)uVar3;
    if ((char)unaff_RBP != ',') {
      if (((uVar4 & 0xff) == 10) || ((uVar3 & 0xff) == 0)) {
        while (cVar1 = peekChar(this), cVar1 == '\n') {
          nextChar(this);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_80,&optionValues);
        setCheckConfig(this,&optionName,&local_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        this->parserState = Initial;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&optionValues);
        std::__cxx11::string::~string((string *)&optionName);
        return;
      }
      goto LAB_0018bd3d;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,&optionValues);
    setCheckConfig(this,&optionName,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    cVar1 = nextChar(this);
    if (cVar1 != '\n') goto LAB_0018bd0a;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&optionValues);
    std::__cxx11::string::~string((string *)&optionName);
  } while( true );
}

Assistant:

void TidyConfigParser::parseCheckConfigs() {
    while (!fileStream.eof()) {
        // Parse optional newline
        if (peekChar() == '\n')
            nextChar();

        // Parse option name
        std::string optionName;
        char currentChar = readIf(optionName, isalpha);

        if (currentChar != ':') {
            reportErrorAndExit(fmt::format("Expected ':' or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse multiple option values
        std::vector<std::string> optionValues;

        auto isRegexMeta = [](char c) {
            return c == '.' || c == '^' || c == '$' || c == '*' || c == '+' || c == '?' ||
                   c == '{' || c == '}' || c == '[' || c == ']' || c == '\\' || c == '|' ||
                   c == '(' || c == ')';
        };

        auto isOptionValueChar = [](char c) { return isalnum(c) || c == '_'; };
        auto isRegexOptionValueChar = [&](char c) {
            return isalnum(c) || isRegexMeta(c) || c == '_';
        };

        if (peekChar() == '[') {
            currentChar = nextChar(); // skip '['

            do {
                std::string optionValue;
                currentChar = readIf(optionValue, isOptionValueChar);
                if (!optionValue.empty())
                    optionValues.emplace_back(optionValue);
            } while (currentChar == ',');

            if (currentChar != ']') {
                reportErrorAndExit(
                    fmt::format("Expected ']' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else if (peekChar() == '"') {
            currentChar = nextChar(); // skip '"'

            std::string optionValue;
            currentChar = readIf(optionValue, isRegexOptionValueChar);
            if (!optionValue.empty())
                optionValues.emplace_back((optionValue));

            if (currentChar != '"') {
                reportErrorAndExit(
                    fmt::format("Expected '\"' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else { // Parse single option value
            std::string optionValue;
            currentChar = readIf(optionValue, isOptionValueChar);
            optionValues.emplace_back(optionValue);
        }

        if (currentChar == ',') {
            setCheckConfig(optionName, optionValues);
            if (nextChar() != '\n') {
                reportErrorAndExit(
                    fmt::format("Expected new line but found: ({}){}", +currentChar, currentChar));
            }
        }
        else if (currentChar == '\n' || currentChar == 0) {
            while (peekChar() == '\n')
                nextChar();
            setCheckConfig(optionName, optionValues);
            parserState = ParserState::Initial;
            return;
        }
        else {
            reportErrorAndExit(fmt::format("Expected ',' new line or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }
    }
}